

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
libcellml::Parser::ParserImpl::loadUnits(ParserImpl *this,UnitsPtr *units,XmlNodePtr *node)

{
  IssueImpl *pIVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  shared_ptr<libcellml::XmlNode> local_420;
  string local_410;
  string local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  undefined1 local_350 [8];
  IssuePtr issue_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  undefined1 local_2a0 [8];
  IssuePtr issue_2;
  string textNode;
  XmlNodePtr childNode;
  string local_258;
  undefined1 local_238 [8];
  IssuePtr issue_1;
  string local_218;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  IssuePtr issue;
  string local_68;
  byte local_31;
  undefined1 local_30 [7];
  bool nameAttributePresent;
  XmlAttributePtr attribute;
  XmlNodePtr *node_local;
  UnitsPtr *units_local;
  ParserImpl *this_local;
  
  attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)node;
  std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             node);
  XmlNode::firstAttribute((XmlNode *)local_30);
  local_31 = 0;
  while (bVar2 = std::operator!=((shared_ptr<libcellml::XmlAttribute> *)local_30,(nullptr_t)0x0),
        bVar2) {
    peVar3 = std::
             __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    bVar2 = XmlAttribute::isType(peVar3,"name","");
    if (bVar2) {
      peVar7 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)units);
      peVar3 = std::
               __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
      XmlAttribute::value_abi_cxx11_(&local_68,peVar3);
      NamedEntity::setName(&peVar7->super_NamedEntity,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      local_31 = 1;
    }
    else {
      bVar2 = isIdAttribute((XmlAttributePtr *)local_30,(bool)(this->mParsing1XVersion & 1));
      if (bVar2) {
        peVar7 = std::
                 __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)units);
        peVar3 = std::
                 __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_30);
        XmlAttribute::value_abi_cxx11_
                  ((string *)
                   &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,peVar3);
        Entity::setId((Entity *)peVar7,
                      (string *)
                      &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
        std::__cxx11::string::~string
                  ((string *)
                   &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      else {
        Issue::IssueImpl::create();
        if ((this->mParsing1XVersion & 1U) == 0) {
          peVar4 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_98);
          pIVar1 = peVar4->mPimpl;
          peVar7 = std::
                   __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)units);
          NamedEntity::name_abi_cxx11_(&local_1f8,&peVar7->super_NamedEntity);
          std::operator+(&local_1d8,"Units \'",&local_1f8);
          std::operator+(&local_1b8,&local_1d8,"\' has an invalid attribute \'");
          peVar3 = std::
                   __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_30);
          XmlAttribute::name_abi_cxx11_(&local_218,peVar3);
          std::operator+(&local_198,&local_1b8,&local_218);
          std::operator+(&local_178,&local_198,"\'.");
          Issue::IssueImpl::setDescription(pIVar1,&local_178);
          std::__cxx11::string::~string((string *)&local_178);
          std::__cxx11::string::~string((string *)&local_198);
          std::__cxx11::string::~string((string *)&local_218);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::__cxx11::string::~string((string *)&local_1f8);
          peVar4 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_98);
          Issue::IssueImpl::setReferenceRule(peVar4->mPimpl,UNITS_ELEMENT);
        }
        else {
          peVar4 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_98);
          pIVar1 = peVar4->mPimpl;
          peVar7 = std::
                   __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)units);
          NamedEntity::name_abi_cxx11_(&local_138,&peVar7->super_NamedEntity);
          std::operator+(&local_118,"Units \'",&local_138);
          std::operator+(&local_f8,&local_118,"\' ignoring attribute \'");
          peVar3 = std::
                   __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_30);
          XmlAttribute::name_abi_cxx11_(&local_158,peVar3);
          std::operator+(&local_d8,&local_f8,&local_158);
          std::operator+(&local_b8,&local_d8,"\'.");
          Issue::IssueImpl::setDescription(pIVar1,&local_b8);
          std::__cxx11::string::~string((string *)&local_b8);
          std::__cxx11::string::~string((string *)&local_d8);
          std::__cxx11::string::~string((string *)&local_158);
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_118);
          std::__cxx11::string::~string((string *)&local_138);
          peVar4 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_98);
          Issue::IssueImpl::setLevel(peVar4->mPimpl,MESSAGE);
        }
        peVar4 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_98);
        peVar5 = std::
                 __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar4->mPimpl->mItem);
        AnyCellmlElement::AnyCellmlElementImpl::setUnits(peVar5->mPimpl,units);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_98);
        std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_98);
      }
    }
    std::__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_30);
    XmlAttribute::next((XmlAttribute *)
                       &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    std::shared_ptr<libcellml::XmlAttribute>::operator=
              ((shared_ptr<libcellml::XmlAttribute> *)local_30,
               (shared_ptr<libcellml::XmlAttribute> *)
               &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::shared_ptr<libcellml::XmlAttribute>::~shared_ptr
              ((shared_ptr<libcellml::XmlAttribute> *)
               &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
  }
  if ((local_31 & 1) == 0) {
    Issue::IssueImpl::create();
    peVar4 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_238);
    pIVar1 = peVar4->mPimpl;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"Units does not specify a name attribute.",
               (allocator<char> *)
               ((long)&childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    Issue::IssueImpl::setDescription(pIVar1,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    peVar4 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_238);
    peVar5 = std::
             __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar4->mPimpl->mItem);
    AnyCellmlElement::AnyCellmlElementImpl::setUnits(peVar5->mPimpl,units);
    peVar4 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_238);
    Issue::IssueImpl::setReferenceRule(peVar4->mPimpl,UNITS_NAME);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_238);
    std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_238);
  }
  std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  XmlNode::firstChild((XmlNode *)((long)&textNode.field_2 + 8));
  while (bVar2 = std::operator!=((shared_ptr<libcellml::XmlNode> *)((long)&textNode.field_2 + 8),
                                 (nullptr_t)0x0), bVar2) {
    bVar2 = parseNode(this,(XmlNodePtr *)((long)&textNode.field_2 + 8),"unit");
    if (bVar2) {
      loadUnit(this,units,(XmlNodePtr *)((long)&textNode.field_2 + 8));
    }
    else {
      peVar6 = std::
               __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(textNode.field_2._M_local_buf + 8));
      bVar2 = XmlNode::isText(peVar6);
      if (bVar2) {
        peVar6 = std::
                 __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(textNode.field_2._M_local_buf + 8));
        XmlNode::convertToString_abi_cxx11_
                  ((string *)
                   &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,peVar6);
        bVar2 = hasNonWhitespaceCharacters
                          ((string *)
                           &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
        if (bVar2) {
          Issue::IssueImpl::create();
          peVar4 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_2a0);
          pIVar1 = peVar4->mPimpl;
          peVar7 = std::
                   __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)units);
          NamedEntity::name_abi_cxx11_
                    ((string *)
                     &issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,&peVar7->super_NamedEntity);
          std::operator+(&local_320,"Units \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
          std::operator+(&local_300,&local_320,
                         "\' has an invalid non-whitespace child text element \'");
          std::operator+(&local_2e0,&local_300,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
          std::operator+(&local_2c0,&local_2e0,"\'.");
          Issue::IssueImpl::setDescription(pIVar1,&local_2c0);
          std::__cxx11::string::~string((string *)&local_2c0);
          std::__cxx11::string::~string((string *)&local_2e0);
          std::__cxx11::string::~string((string *)&local_300);
          std::__cxx11::string::~string((string *)&local_320);
          std::__cxx11::string::~string
                    ((string *)
                     &issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          peVar4 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_2a0);
          peVar5 = std::
                   __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&peVar4->mPimpl->mItem);
          AnyCellmlElement::AnyCellmlElementImpl::setUnits(peVar5->mPimpl,units);
          peVar4 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_2a0);
          Issue::IssueImpl::setReferenceRule(peVar4->mPimpl,XML_UNEXPECTED_CHARACTER);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_2a0);
          std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_2a0);
        }
        std::__cxx11::string::~string
                  ((string *)
                   &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      else {
        peVar6 = std::
                 __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(textNode.field_2._M_local_buf + 8));
        bVar2 = XmlNode::isComment(peVar6);
        if (!bVar2) {
          Issue::IssueImpl::create();
          peVar4 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_350);
          pIVar1 = peVar4->mPimpl;
          peVar7 = std::
                   __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)units);
          NamedEntity::name_abi_cxx11_(&local_3f0,&peVar7->super_NamedEntity);
          std::operator+(&local_3d0,"Units \'",&local_3f0);
          std::operator+(&local_3b0,&local_3d0,"\' has an invalid child element \'");
          peVar6 = std::
                   __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)(textNode.field_2._M_local_buf + 8));
          XmlNode::name_abi_cxx11_(&local_410,peVar6);
          std::operator+(&local_390,&local_3b0,&local_410);
          std::operator+(&local_370,&local_390,"\'.");
          Issue::IssueImpl::setDescription(pIVar1,&local_370);
          std::__cxx11::string::~string((string *)&local_370);
          std::__cxx11::string::~string((string *)&local_390);
          std::__cxx11::string::~string((string *)&local_410);
          std::__cxx11::string::~string((string *)&local_3b0);
          std::__cxx11::string::~string((string *)&local_3d0);
          std::__cxx11::string::~string((string *)&local_3f0);
          peVar4 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_350);
          peVar5 = std::
                   __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&peVar4->mPimpl->mItem);
          AnyCellmlElement::AnyCellmlElementImpl::setUnits(peVar5->mPimpl,units);
          peVar4 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_350);
          Issue::IssueImpl::setReferenceRule(peVar4->mPimpl,XML_UNEXPECTED_ELEMENT);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_350);
          std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_350);
        }
      }
    }
    std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               (textNode.field_2._M_local_buf + 8));
    XmlNode::next((XmlNode *)&local_420);
    std::shared_ptr<libcellml::XmlNode>::operator=
              ((shared_ptr<libcellml::XmlNode> *)((long)&textNode.field_2 + 8),&local_420);
    std::shared_ptr<libcellml::XmlNode>::~shared_ptr(&local_420);
  }
  std::shared_ptr<libcellml::XmlNode>::~shared_ptr
            ((shared_ptr<libcellml::XmlNode> *)((long)&textNode.field_2 + 8));
  std::shared_ptr<libcellml::XmlAttribute>::~shared_ptr
            ((shared_ptr<libcellml::XmlAttribute> *)local_30);
  return;
}

Assistant:

void Parser::ParserImpl::loadUnits(const UnitsPtr &units, const XmlNodePtr &node)
{
    XmlAttributePtr attribute = node->firstAttribute();
    bool nameAttributePresent = false;
    while (attribute != nullptr) {
        if (attribute->isType("name")) {
            units->setName(attribute->value());
            nameAttributePresent = true;
        } else if (isIdAttribute(attribute, mParsing1XVersion)) {
            units->setId(attribute->value());
        } else {
            auto issue = Issue::IssueImpl::create();
            if (mParsing1XVersion) {
                issue->mPimpl->setDescription("Units '" + units->name() + "' ignoring attribute '" + attribute->name() + "'.");
                issue->mPimpl->setLevel(Issue::Level::MESSAGE);
            } else {
                issue->mPimpl->setDescription("Units '" + units->name() + "' has an invalid attribute '" + attribute->name() + "'.");
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNITS_ELEMENT);
            }
            issue->mPimpl->mItem->mPimpl->setUnits(units);
            addIssue(issue);
        }
        attribute = attribute->next();
    }

    if (!nameAttributePresent) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Units does not specify a name attribute.");
        issue->mPimpl->mItem->mPimpl->setUnits(units);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNITS_NAME);
        addIssue(issue);
    }

    XmlNodePtr childNode = node->firstChild();
    while (childNode != nullptr) {
        if (parseNode(childNode, "unit")) {
            loadUnit(units, childNode);
        } else if (childNode->isText()) {
            std::string textNode = childNode->convertToString();
            // Ignore whitespace when parsing.
            if (hasNonWhitespaceCharacters(textNode)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Units '" + units->name() + "' has an invalid non-whitespace child text element '" + textNode + "'.");
                issue->mPimpl->mItem->mPimpl->setUnits(units);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_CHARACTER);
                addIssue(issue);
            }
        } else if (childNode->isComment()) {
            // Do nothing.
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Units '" + units->name() + "' has an invalid child element '" + childNode->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setUnits(units);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_ELEMENT);
            addIssue(issue);
        }
        childNode = childNode->next();
    }
}